

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O0

void free_config_fields(OperationConfig *config)

{
  getout *pgVar1;
  getout *next;
  getout *urlnode;
  OperationConfig *config_local;
  
  free(config->useragent);
  config->useragent = (char *)0x0;
  free(config->altsvc);
  config->altsvc = (char *)0x0;
  free(config->hsts);
  config->hsts = (char *)0x0;
  free(config->haproxy_clientip);
  config->haproxy_clientip = (char *)0x0;
  curl_slist_free_all(config->cookies);
  free(config->cookiejar);
  config->cookiejar = (char *)0x0;
  curl_slist_free_all(config->cookiefiles);
  curlx_dyn_free(&config->postdata);
  free(config->query);
  config->query = (char *)0x0;
  free(config->referer);
  config->referer = (char *)0x0;
  free(config->headerfile);
  config->headerfile = (char *)0x0;
  free(config->ftpport);
  config->ftpport = (char *)0x0;
  free(config->iface);
  config->iface = (char *)0x0;
  free(config->range);
  config->range = (char *)0x0;
  free(config->userpwd);
  config->userpwd = (char *)0x0;
  free(config->tls_username);
  config->tls_username = (char *)0x0;
  free(config->tls_password);
  config->tls_password = (char *)0x0;
  free(config->tls_authtype);
  config->tls_authtype = (char *)0x0;
  free(config->proxy_tls_username);
  config->proxy_tls_username = (char *)0x0;
  free(config->proxy_tls_password);
  config->proxy_tls_password = (char *)0x0;
  free(config->proxy_tls_authtype);
  config->proxy_tls_authtype = (char *)0x0;
  free(config->proxyuserpwd);
  config->proxyuserpwd = (char *)0x0;
  free(config->proxy);
  config->proxy = (char *)0x0;
  free(config->dns_ipv6_addr);
  config->dns_ipv6_addr = (char *)0x0;
  free(config->dns_ipv4_addr);
  config->dns_ipv4_addr = (char *)0x0;
  free(config->dns_interface);
  config->dns_interface = (char *)0x0;
  free(config->dns_servers);
  config->dns_servers = (char *)0x0;
  free(config->noproxy);
  config->noproxy = (char *)0x0;
  free(config->mail_from);
  config->mail_from = (char *)0x0;
  curl_slist_free_all(config->mail_rcpt);
  free(config->mail_auth);
  config->mail_auth = (char *)0x0;
  free(config->netrc_file);
  config->netrc_file = (char *)0x0;
  free(config->output_dir);
  config->output_dir = (char *)0x0;
  free(config->proto_str);
  config->proto_str = (char *)0x0;
  free(config->proto_redir_str);
  config->proto_redir_str = (char *)0x0;
  next = config->url_list;
  while (next != (getout *)0x0) {
    pgVar1 = next->next;
    free(next->url);
    next->url = (char *)0x0;
    free(next->outfile);
    next->outfile = (char *)0x0;
    free(next->infile);
    next->infile = (char *)0x0;
    free(next);
    next = pgVar1;
  }
  config->url_list = (getout *)0x0;
  config->url_last = (getout *)0x0;
  config->url_get = (getout *)0x0;
  config->url_out = (getout *)0x0;
  free(config->ipfs_gateway);
  config->ipfs_gateway = (char *)0x0;
  free(config->doh_url);
  config->doh_url = (char *)0x0;
  free(config->cipher_list);
  config->cipher_list = (char *)0x0;
  free(config->proxy_cipher_list);
  config->proxy_cipher_list = (char *)0x0;
  free(config->cipher13_list);
  config->cipher13_list = (char *)0x0;
  free(config->proxy_cipher13_list);
  config->proxy_cipher13_list = (char *)0x0;
  free(config->cert);
  config->cert = (char *)0x0;
  free(config->proxy_cert);
  config->proxy_cert = (char *)0x0;
  free(config->cert_type);
  config->cert_type = (char *)0x0;
  free(config->proxy_cert_type);
  config->proxy_cert_type = (char *)0x0;
  free(config->cacert);
  config->cacert = (char *)0x0;
  free(config->login_options);
  config->login_options = (char *)0x0;
  free(config->proxy_cacert);
  config->proxy_cacert = (char *)0x0;
  free(config->capath);
  config->capath = (char *)0x0;
  free(config->proxy_capath);
  config->proxy_capath = (char *)0x0;
  free(config->crlfile);
  config->crlfile = (char *)0x0;
  free(config->pinnedpubkey);
  config->pinnedpubkey = (char *)0x0;
  free(config->proxy_pinnedpubkey);
  config->proxy_pinnedpubkey = (char *)0x0;
  free(config->proxy_crlfile);
  config->proxy_crlfile = (char *)0x0;
  free(config->key);
  config->key = (char *)0x0;
  free(config->proxy_key);
  config->proxy_key = (char *)0x0;
  free(config->key_type);
  config->key_type = (char *)0x0;
  free(config->proxy_key_type);
  config->proxy_key_type = (char *)0x0;
  free(config->key_passwd);
  config->key_passwd = (char *)0x0;
  free(config->proxy_key_passwd);
  config->proxy_key_passwd = (char *)0x0;
  free(config->pubkey);
  config->pubkey = (char *)0x0;
  free(config->hostpubmd5);
  config->hostpubmd5 = (char *)0x0;
  free(config->hostpubsha256);
  config->hostpubsha256 = (char *)0x0;
  free(config->engine);
  config->engine = (char *)0x0;
  free(config->etag_save_file);
  config->etag_save_file = (char *)0x0;
  free(config->etag_compare_file);
  config->etag_compare_file = (char *)0x0;
  free(config->ssl_ec_curves);
  config->ssl_ec_curves = (char *)0x0;
  free(config->request_target);
  config->request_target = (char *)0x0;
  free(config->customrequest);
  config->customrequest = (char *)0x0;
  free(config->krblevel);
  config->krblevel = (char *)0x0;
  free(config->oauth_bearer);
  config->oauth_bearer = (char *)0x0;
  free(config->sasl_authzid);
  config->sasl_authzid = (char *)0x0;
  free(config->unix_socket_path);
  config->unix_socket_path = (char *)0x0;
  free(config->writeout);
  config->writeout = (char *)0x0;
  free(config->proto_default);
  config->proto_default = (char *)0x0;
  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);
  curl_slist_free_all(config->headers);
  curl_slist_free_all(config->proxyheaders);
  curl_mime_free(config->mimepost);
  config->mimepost = (curl_mime *)0x0;
  tool_mime_free(config->mimeroot);
  config->mimeroot = (tool_mime *)0x0;
  config->mimecurrent = (tool_mime *)0x0;
  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);
  curl_slist_free_all(config->connect_to);
  free(config->preproxy);
  config->preproxy = (char *)0x0;
  free(config->proxy_service_name);
  config->proxy_service_name = (char *)0x0;
  free(config->service_name);
  config->service_name = (char *)0x0;
  free(config->ftp_account);
  config->ftp_account = (char *)0x0;
  free(config->ftp_alternative_to_user);
  config->ftp_alternative_to_user = (char *)0x0;
  free(config->aws_sigv4);
  config->aws_sigv4 = (char *)0x0;
  free(config->proto_str);
  config->proto_str = (char *)0x0;
  free(config->proto_redir_str);
  config->proto_redir_str = (char *)0x0;
  free(config->ech);
  config->ech = (char *)0x0;
  free(config->ech_config);
  config->ech_config = (char *)0x0;
  free(config->ech_public);
  config->ech_public = (char *)0x0;
  return;
}

Assistant:

static void free_config_fields(struct OperationConfig *config)
{
  struct getout *urlnode;

  curlx_safefree(config->useragent);
  curlx_safefree(config->altsvc);
  curlx_safefree(config->hsts);
  curlx_safefree(config->haproxy_clientip);
  curl_slist_free_all(config->cookies);
  curlx_safefree(config->cookiejar);
  curl_slist_free_all(config->cookiefiles);

  curlx_dyn_free(&config->postdata);
  curlx_safefree(config->query);
  curlx_safefree(config->referer);

  curlx_safefree(config->headerfile);
  curlx_safefree(config->ftpport);
  curlx_safefree(config->iface);

  curlx_safefree(config->range);

  curlx_safefree(config->userpwd);
  curlx_safefree(config->tls_username);
  curlx_safefree(config->tls_password);
  curlx_safefree(config->tls_authtype);
  curlx_safefree(config->proxy_tls_username);
  curlx_safefree(config->proxy_tls_password);
  curlx_safefree(config->proxy_tls_authtype);
  curlx_safefree(config->proxyuserpwd);
  curlx_safefree(config->proxy);

  curlx_safefree(config->dns_ipv6_addr);
  curlx_safefree(config->dns_ipv4_addr);
  curlx_safefree(config->dns_interface);
  curlx_safefree(config->dns_servers);

  curlx_safefree(config->noproxy);

  curlx_safefree(config->mail_from);
  curl_slist_free_all(config->mail_rcpt);
  curlx_safefree(config->mail_auth);

  curlx_safefree(config->netrc_file);
  curlx_safefree(config->output_dir);
  curlx_safefree(config->proto_str);
  curlx_safefree(config->proto_redir_str);

  urlnode = config->url_list;
  while(urlnode) {
    struct getout *next = urlnode->next;
    curlx_safefree(urlnode->url);
    curlx_safefree(urlnode->outfile);
    curlx_safefree(urlnode->infile);
    curlx_safefree(urlnode);
    urlnode = next;
  }
  config->url_list = NULL;
  config->url_last = NULL;
  config->url_get = NULL;
  config->url_out = NULL;

#ifndef CURL_DISABLE_IPFS
  curlx_safefree(config->ipfs_gateway);
#endif /* !CURL_DISABLE_IPFS */
  curlx_safefree(config->doh_url);
  curlx_safefree(config->cipher_list);
  curlx_safefree(config->proxy_cipher_list);
  curlx_safefree(config->cipher13_list);
  curlx_safefree(config->proxy_cipher13_list);
  curlx_safefree(config->cert);
  curlx_safefree(config->proxy_cert);
  curlx_safefree(config->cert_type);
  curlx_safefree(config->proxy_cert_type);
  curlx_safefree(config->cacert);
  curlx_safefree(config->login_options);
  curlx_safefree(config->proxy_cacert);
  curlx_safefree(config->capath);
  curlx_safefree(config->proxy_capath);
  curlx_safefree(config->crlfile);
  curlx_safefree(config->pinnedpubkey);
  curlx_safefree(config->proxy_pinnedpubkey);
  curlx_safefree(config->proxy_crlfile);
  curlx_safefree(config->key);
  curlx_safefree(config->proxy_key);
  curlx_safefree(config->key_type);
  curlx_safefree(config->proxy_key_type);
  curlx_safefree(config->key_passwd);
  curlx_safefree(config->proxy_key_passwd);
  curlx_safefree(config->pubkey);
  curlx_safefree(config->hostpubmd5);
  curlx_safefree(config->hostpubsha256);
  curlx_safefree(config->engine);
  curlx_safefree(config->etag_save_file);
  curlx_safefree(config->etag_compare_file);
  curlx_safefree(config->ssl_ec_curves);
  curlx_safefree(config->request_target);
  curlx_safefree(config->customrequest);
  curlx_safefree(config->krblevel);
  curlx_safefree(config->oauth_bearer);
  curlx_safefree(config->sasl_authzid);
  curlx_safefree(config->unix_socket_path);
  curlx_safefree(config->writeout);
  curlx_safefree(config->proto_default);

  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);

  curl_slist_free_all(config->headers);
  curl_slist_free_all(config->proxyheaders);

  curl_mime_free(config->mimepost);
  config->mimepost = NULL;
  tool_mime_free(config->mimeroot);
  config->mimeroot = NULL;
  config->mimecurrent = NULL;

  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);
  curl_slist_free_all(config->connect_to);

  curlx_safefree(config->preproxy);
  curlx_safefree(config->proxy_service_name);
  curlx_safefree(config->service_name);
  curlx_safefree(config->ftp_account);
  curlx_safefree(config->ftp_alternative_to_user);
  curlx_safefree(config->aws_sigv4);
  curlx_safefree(config->proto_str);
  curlx_safefree(config->proto_redir_str);
  curlx_safefree(config->ech);
  curlx_safefree(config->ech_config);
  curlx_safefree(config->ech_public);
}